

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O0

void * duckdb_je_bootstrap_calloc(size_t num,size_t size)

{
  void *pvVar1;
  size_t num_size;
  _Bool in_stack_0000003e;
  _Bool in_stack_0000003f;
  size_t in_stack_00000040;
  
  pvVar1 = a0ialloc(in_stack_00000040,in_stack_0000003f,in_stack_0000003e);
  return pvVar1;
}

Assistant:

void *
bootstrap_calloc(size_t num, size_t size) {
	size_t num_size;

	num_size = num * size;
	if (unlikely(num_size == 0)) {
		assert(num == 0 || size == 0);
		num_size = 1;
	}

	return a0ialloc(num_size, true, false);
}